

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O1

float point_triangle_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2,Vec3f *x3)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint i;
  long lVar7;
  Vec3f *x2_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [60];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [64];
  Vec<3U,_float> diff;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  float fStack_38;
  undefined8 local_30;
  float fStack_28;
  
  fVar2 = fStack_74;
  fStack_78 = x1->v[2];
  local_80 = (undefined1  [8])*(undefined8 *)x1->v;
  auVar8._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar8._12_4_ = 0;
  auVar14._0_12_ = local_80._0_12_;
  auVar14._12_4_ = 0;
  auVar8 = vsubps_avx(auVar14,auVar8);
  local_80 = auVar8._0_8_;
  fStack_78 = auVar8._8_4_;
  local_60 = local_80;
  uVar5 = local_60;
  local_58 = fStack_78;
  fStack_78 = x2->v[2];
  _local_80 = CONCAT412(fVar2,_local_80);
  local_80 = (undefined1  [8])*(undefined8 *)x2->v;
  auVar9._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar9._12_4_ = 0;
  auVar10._0_12_ = local_80._0_12_;
  auVar10._12_4_ = 0;
  auVar14 = vsubps_avx(auVar10,auVar9);
  local_80 = auVar14._0_8_;
  fStack_78 = auVar14._8_4_;
  local_70 = local_80;
  uVar4 = local_70;
  local_68 = fStack_78;
  fStack_78 = x0->v[2];
  _local_80 = CONCAT412(fVar2,_local_80);
  local_80 = (undefined1  [8])*(undefined8 *)x0->v;
  auVar11._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar11._12_4_ = 0;
  auVar12._0_12_ = local_80._0_12_;
  auVar12._12_4_ = 0;
  auVar9 = vsubps_avx(auVar12,auVar11);
  auVar13._0_12_ = auVar9._0_12_;
  auVar13._12_4_ = fVar2;
  local_80 = auVar9._0_8_;
  fStack_78 = auVar9._8_4_;
  local_50 = local_80;
  uVar6 = local_50;
  local_48 = fStack_78;
  local_60._0_4_ = auVar8._0_4_;
  fVar15 = (float)local_60 * (float)local_60;
  lVar7 = 1;
  do {
    fVar1 = *(float *)((long)&local_60 + lVar7 * 4);
    fVar15 = fVar15 + fVar1 * fVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_70._0_4_ = auVar14._0_4_;
  fVar1 = (float)local_70 * (float)local_70;
  lVar7 = 1;
  do {
    fVar16 = *(float *)((long)&local_70 + lVar7 * 4);
    fVar1 = fVar1 + fVar16 * fVar16;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auVar19 = ZEXT464((uint)((float)local_60 * (float)local_70));
  lVar7 = 1;
  do {
    auVar8 = vfmadd231ss_fma(auVar19._0_16_,ZEXT416(*(uint *)((long)&local_60 + lVar7 * 4)),
                             ZEXT416(*(uint *)((long)&local_70 + lVar7 * 4)));
    auVar19 = ZEXT1664(auVar8);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar8,auVar3);
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar8._0_4_)),ZEXT416((uint)fVar15),
                           ZEXT416((uint)fVar1));
  auVar8 = vmaxss_avx(SUB6416(ZEXT464(0xda24260),0),auVar8);
  local_50._0_4_ = auVar9._0_4_;
  auVar19 = ZEXT464((uint)((float)local_60 * (float)local_50));
  lVar7 = 1;
  do {
    auVar9 = vfmadd231ss_fma(auVar19._0_16_,ZEXT416(*(uint *)((long)&local_60 + lVar7 * 4)),
                             ZEXT416(*(uint *)((long)&local_50 + lVar7 * 4)));
    auVar19 = ZEXT1664(auVar9);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auVar19 = ZEXT464((uint)((float)local_70 * (float)local_50));
  lVar7 = 1;
  do {
    auVar10 = vfmadd231ss_fma(auVar19._0_16_,ZEXT416(*(uint *)((long)&local_70 + lVar7 * 4)),
                              ZEXT416(*(uint *)((long)&local_50 + lVar7 * 4)));
    auVar19 = ZEXT1664(auVar10);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  fStack_28 = 1.0 / auVar8._0_4_;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar9,
                           ZEXT416((uint)(auVar10._0_4_ * auVar14._0_4_)));
  fVar1 = fStack_28 * auVar8._0_4_;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar15),auVar10,
                           ZEXT416((uint)(auVar9._0_4_ * auVar14._0_4_)));
  fStack_28 = fStack_28 * auVar8._0_4_;
  local_70 = uVar4;
  local_60 = uVar5;
  local_50 = uVar6;
  if (((fStack_28 < 0.0) || (fVar1 < 0.0)) ||
     (fStack_38 = (1.0 - fVar1) - fStack_28, fStack_38 < 0.0)) {
    _local_80 = auVar13;
    if (fVar1 <= 0.0) {
      x2_00 = x3;
      if (0.0 < fStack_28) {
        x2_00 = x2;
      }
      fVar15 = point_segment_distance(x0,x1,x2_00);
      x1 = x2;
      fStack_74 = fVar15;
    }
    else {
      fVar15 = point_segment_distance(x0,x1,x2);
      fStack_74 = fVar15;
    }
    auVar19._0_4_ = point_segment_distance(x0,x1,x3);
    auVar19._4_60_ = extraout_var;
    auVar8 = vminss_avx(auVar19._0_16_,ZEXT416((uint)fStack_74));
    fVar15 = auVar8._0_4_;
  }
  else {
    local_80._0_4_ = (undefined4)*(undefined8 *)x1->v;
    local_80._4_4_ = (undefined4)((ulong)*(undefined8 *)x1->v >> 0x20);
    fVar17 = fVar1 * (float)local_80._0_4_;
    fVar18 = fVar1 * (float)local_80._4_4_;
    local_80._0_4_ = (undefined4)*(undefined8 *)x2->v;
    local_80._4_4_ = (undefined4)((ulong)*(undefined8 *)x2->v >> 0x20);
    fVar15 = fStack_28 * (float)local_80._0_4_;
    fVar16 = fStack_28 * (float)local_80._4_4_;
    fStack_28 = fStack_28 * x2->v[2];
    local_80._4_4_ = fVar16;
    local_80._0_4_ = fVar15;
    local_30 = local_80;
    local_80._0_4_ = (undefined4)*(undefined8 *)x3->v;
    local_80._4_4_ = (undefined4)((ulong)*(undefined8 *)x3->v >> 0x20);
    local_80._0_4_ = fStack_38 * (float)local_80._0_4_;
    local_80._4_4_ = fStack_38 * (float)local_80._4_4_;
    fStack_38 = fStack_38 * x3->v[2];
    local_40 = local_80;
    local_80._0_4_ = (float)local_80._0_4_ + fVar15 + fVar17;
    local_80._4_4_ = (float)local_80._4_4_ + fVar16 + fVar18;
    fStack_78 = fStack_38 + fStack_28 + fVar1 * x1->v[2];
    _local_80 = CONCAT412(fVar2,_local_80);
    fVar15 = x0->v[0] - (float)local_80._0_4_;
    fVar15 = fVar15 * fVar15;
    lVar7 = 1;
    do {
      fVar2 = x0->v[lVar7] - *(float *)(local_80 + lVar7 * 4);
      fVar15 = fVar15 + fVar2 * fVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar8 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar8._0_4_;
    }
  }
  return fVar15;
}

Assistant:

static float point_triangle_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2,
                                     const Vec3f &x3) {
  // first find barycentric coordinates of closest point on infinite plane
  Vec3f x13(x1 - x3), x23(x2 - x3), x03(x0 - x3);
  float m13 = mag2(x13), m23 = mag2(x23), d = dot(x13, x23);
  float invdet = 1.f / max(m13 * m23 - d * d, 1e-30f);
  float a = dot(x13, x03), b = dot(x23, x03);
  // the barycentric coordinates themselves
  float w23 = invdet * (m23 * a - d * b);
  float w31 = invdet * (m13 * b - d * a);
  float w12 = 1 - w23 - w31;
  if (w23 >= 0 && w31 >= 0 && w12 >= 0) {  // if we're inside the triangle
    return dist(x0, w23 * x1 + w31 * x2 + w12 * x3);
  } else {        // we have to clamp to one of the edges
    if (w23 > 0)  // this rules out edge 2-3 for us
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x1, x3));
    else if (w31 > 0)  // this rules out edge 1-3
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x2, x3));
    else  // w12 must be >0, ruling out edge 1-2
      return min(point_segment_distance(x0, x1, x3), point_segment_distance(x0, x2, x3));
  }
}